

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O2

bool pd::prepareDataPhrasesFromWordvec
               (string *dir_name,string *data_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               *words_dict)

{
  pointer pdVar1;
  bool bVar2;
  bool bVar3;
  reference p;
  ostream *poVar4;
  istream *piVar5;
  const_iterator cVar6;
  uint uVar7;
  undefined1 auVar8 [8];
  undefined1 local_4f8 [8];
  ofstream of;
  undefined1 local_2f8 [8];
  ifstream fi;
  uint auStack_2d8 [122];
  string local_f0 [8];
  path targetDir;
  undefined1 local_b0 [8];
  string line;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> local_88;
  undefined1 auStack_78 [8];
  vector<double,_std::allocator<double>_> result;
  directory_iterator local_58;
  directory_iterator it;
  directory_iterator eod;
  directory_iterator local_38;
  
  std::__cxx11::string::string(local_f0,(string *)dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_58,(path *)local_f0,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::ofstream::ofstream(local_4f8,(string *)data_filename,_S_out);
  local_2f8 = (undefined1  [8])local_58.m_imp.px;
  if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
    UNLOCK();
  }
  _fi = (directory_iterator)(directory_iterator)it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  local_88.first.m_imp.px = local_58.m_imp.px;
  if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
    UNLOCK();
  }
  local_88.second = (directory_iterator)(directory_iterator)it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             local_2f8);
  boost::foreach_detail_::
  begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&local_38,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&local_88,(true_ *)0x0);
  boost::foreach_detail_::
  end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&eod,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&local_88,(true_ *)0x0);
  bVar2 = true;
  line.field_2._8_8_ = words_dict;
  do {
    if ((!bVar2) || (bVar2 = boost::filesystem::directory_iterator::equal(&local_38,&eod), bVar2)) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
      bVar2 = true;
LAB_0012dec2:
      std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
                (&local_88);
      std::ofstream::~ofstream(local_4f8);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_58.m_imp);
      std::__cxx11::string::~string(local_f0);
      return bVar2;
    }
    p = boost::filesystem::directory_iterator::dereference(&local_38);
    bVar2 = false;
    while (!bVar2) {
      bVar3 = boost::filesystem::is_regular_file((path *)p);
      bVar2 = true;
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)p);
        std::endl<char,std::char_traits<char>>(poVar4);
        boost::filesystem::path::extension();
        bVar3 = boost::filesystem::operator==((path *)local_2f8,"swp");
        std::__cxx11::string::~string((string *)local_2f8);
        bVar2 = true;
        if (!bVar3) {
          std::ifstream::ifstream((string *)local_2f8,(string *)p,_S_in);
          uVar7 = *(uint *)((long)auStack_2d8 + *(long *)((long)local_2f8 + -0x18));
          if ((uVar7 & 5) == 0) {
            local_b0 = (undefined1  [8])&line._M_string_length;
            line._M_dataplus._M_p = (pointer)0x0;
            line._M_string_length._0_1_ = 0;
            auStack_78 = (undefined1  [8])0x0;
            result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            while ((piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                       ((istream *)local_2f8,(string *)local_b0),
                   pdVar1 = result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start, auVar8 = auStack_78,
                   ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0 &&
                   (line._M_dataplus._M_p != (pointer)0x0))) {
              cVar6 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&words_dict->_M_h,(key_type *)local_b0);
              if (cVar6.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"word ");
                poVar4 = std::operator<<(poVar4,(string *)local_b0);
                poVar4 = std::operator<<(poVar4," in file ");
                poVar4 = std::operator<<(poVar4,(string *)p);
                poVar4 = std::operator<<(poVar4," isn\'t found in dictionary");
                std::endl<char,std::char_traits<char>>(poVar4);
              }
              else if ((undefined1  [8])
                       result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start == auStack_78) {
                std::vector<double,_std::allocator<double>_>::operator=
                          ((vector<double,_std::allocator<double>_> *)auStack_78,
                           (vector<double,_std::allocator<double>_> *)
                           ((long)cVar6.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                                  ._M_cur + 0x28));
              }
              else {
                std::
                transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                          (auStack_78,
                           result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (((vector<double,_std::allocator<double>_> *)
                            ((long)cVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                                   ._M_cur + 0x28))->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start);
              }
            }
            for (; result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ = uVar7,
                auVar8 != (undefined1  [8])pdVar1; auVar8 = (undefined1  [8])((long)auVar8 + 8)) {
              poVar4 = std::ostream::_M_insert<double>(*(double *)auVar8);
              std::operator<<(poVar4,",");
              uVar7 = result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
            }
            boost::filesystem::path::filename();
            poVar4 = (ostream *)
                     boost::filesystem::operator<<
                               ((basic_ostream<char,_std::char_traits<char>_> *)local_4f8,
                                (path *)((long)&targetDir.m_pathname.field_2 + 8));
            uVar7 = result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
            words_dict = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                          *)line.field_2._8_8_;
            std::endl<char,std::char_traits<char>>(poVar4);
            std::__cxx11::string::~string((string *)(targetDir.m_pathname.field_2._M_local_buf + 8))
            ;
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      ((_Vector_base<double,_std::allocator<double>_> *)auStack_78);
            std::__cxx11::string::~string((string *)local_b0);
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
            poVar4 = std::operator<<(poVar4,(string *)p);
            poVar4 = std::operator<<(poVar4,"doesn\'t exist");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          std::ifstream::~ifstream((string *)local_2f8);
          if ((uVar7 & 5) != 0) {
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp)
            ;
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_38.m_imp);
            bVar2 = false;
            goto LAB_0012dec2;
          }
        }
      }
    }
    boost::filesystem::directory_iterator::increment(&local_38);
  } while( true );
}

Assistant:

bool prepareDataPhrasesFromWordvec(const std::string& dir_name, const std::string& data_filename, const std::unordered_map<std::string, std::vector<double>>& words_dict)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<double> result;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, std::vector<double>>::const_iterator it = words_dict.find(line);
                    if (it == words_dict.end())
                    {
                        std::cerr << "word " << line << " in file " << p.string() << " isn't found in dictionary" << std::endl;
                        //return false;
                        continue;
                    }
                    
                    if (result.size() == 0)
                        result = it->second;
                    else
                        std::transform (result.begin(), result.end(), it->second.begin(), result.begin(), std::plus<double>());                            
                }
                
                for (const double elem: result)
                    of << elem << ",";
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }